

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

Value * duckdb::AllocatorBulkDeallocationFlushThresholdSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  DBConfig *pDVar1;
  idx_t in_RCX;
  string local_30;
  
  pDVar1 = DBConfig::GetConfig(context);
  StringUtil::BytesToHumanReadableString_abi_cxx11_
            (&local_30,(StringUtil *)(pDVar1->options).allocator_bulk_deallocation_flush_threshold,
             0x400,in_RCX);
  Value::Value(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Value AllocatorBulkDeallocationFlushThresholdSetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	return Value(StringUtil::BytesToHumanReadableString(config.options.allocator_bulk_deallocation_flush_threshold));
}